

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_AngleValue *
ON_AngleValue::Create
          (ON_AngleValue *__return_storage_ptr__,double angle_value,
          AngleUnitSystem angle_unit_system,uint locale_id,StringFormat string_format)

{
  double dVar1;
  LengthUnitSystem LVar2;
  StringFormat SVar3;
  AngleUnitSystem AVar4;
  undefined1 uVar5;
  double dVar6;
  bool bVar7;
  wchar_t *pwVar8;
  undefined7 in_register_00000031;
  double denominator;
  double numerator;
  ON_AngleValue rc;
  ON_AngleUnitName name;
  double sign;
  double proper;
  double local_70;
  double local_68;
  uint local_60;
  undefined1 local_5c;
  undefined1 uStack_5b;
  AngleUnitSystem AStack_5a;
  undefined1 uStack_59;
  undefined8 uStack_58;
  ON_wString local_50;
  ON_AngleUnitName local_48;
  double local_38;
  double local_30;
  
  dVar1 = ON_DBL_QNAN;
  local_60 = 0;
  local_5c = 0;
  uStack_5b = 0;
  AStack_5a = Unset;
  uStack_58 = ON_DBL_QNAN;
  ON_wString::ON_wString(&local_50);
  dVar6 = Unset.m_angle;
  if ((int)CONCAT71(in_register_00000031,angle_unit_system) == 0xff || NAN(angle_value)) {
    LVar2 = Unset.m_context_length_unit_system;
    SVar3 = Unset.m_string_format;
    AVar4 = Unset.m_angle_unit_system;
    uVar5 = Unset._7_1_;
    __return_storage_ptr__->m_context_locale_id = Unset.m_context_locale_id;
    __return_storage_ptr__->m_context_length_unit_system = LVar2;
    __return_storage_ptr__->m_string_format = SVar3;
    __return_storage_ptr__->m_angle_unit_system = AVar4;
    __return_storage_ptr__->field_0x7 = uVar5;
    __return_storage_ptr__->m_angle = dVar6;
    ON_wString::ON_wString(&__return_storage_ptr__->m_angle_as_string,&Unset.m_angle_as_string);
    goto LAB_005cbb11;
  }
  AStack_5a = angle_unit_system;
  uStack_58 = angle_value;
  local_48 = ON_AngleUnitName::Create(locale_id,angle_unit_system,1.0 < angle_value);
  local_38 = dVar1;
  local_30 = dVar1;
  local_68 = dVar1;
  local_70 = dVar1;
  if ((string_format - ExactFraction & 0xfd) == 0) {
    bVar7 = ON_IsAnnotationFractionNumber(uStack_58,true,&local_38,&local_30,&local_68,&local_70);
    if (!bVar7) goto LAB_005cba89;
    uStack_58 = (local_38 * local_68) / local_70;
    bVar7 = ON_AngleUnitName::AngleUnitNameIsNotEmpty(&local_48);
    dVar6 = local_68;
    dVar1 = local_70;
    if (bVar7) {
      pwVar8 = ON_AngleUnitName::AngleUnitName(&local_48);
      ON_wString::Format(&local_50,L"%0.17g/%0.17g %ls",dVar6,dVar1,pwVar8);
    }
    else {
      ON_wString::Format(&local_50,L"%0.17g/%0.17g");
    }
  }
  else {
LAB_005cba89:
    bVar7 = ON_AngleUnitName::AngleUnitNameIsNotEmpty(&local_48);
    dVar1 = uStack_58;
    if (bVar7) {
      pwVar8 = ON_AngleUnitName::AngleUnitName(&local_48);
      ON_wString::Format(&local_50,L"%0.17g %ls",dVar1,pwVar8);
    }
    else {
      ON_wString::Format(&local_50,L"%0.17g");
    }
  }
  local_5c = 0;
  local_60 = ON_AngleUnitName::LocaleId(&local_48);
  __return_storage_ptr__->m_context_locale_id = local_60;
  *(ulong *)&__return_storage_ptr__->m_context_length_unit_system =
       CONCAT44((undefined4)uStack_58,
                CONCAT13(uStack_59,CONCAT12(AStack_5a,CONCAT11(uStack_5b,local_5c))));
  *(undefined4 *)((long)&__return_storage_ptr__->m_angle + 4) = uStack_58._4_4_;
  ON_wString::ON_wString(&__return_storage_ptr__->m_angle_as_string,&local_50);
LAB_005cbb11:
  ON_wString::~ON_wString(&local_50);
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::Create(
  double angle_value,
  ON::AngleUnitSystem angle_unit_system,
  unsigned int locale_id,
  ON_AngleValue::StringFormat string_format
)
{
  ON_AngleValue rc;
  for (;;)
  {
    bool bFraction = false;
    bool bClean = false;
    switch (string_format)
    {
    case ON_AngleValue::StringFormat::ExactDecimal:
      break;
    case ON_AngleValue::StringFormat::ExactFraction:
      bFraction = true;
      break;
    case ON_AngleValue::StringFormat::CleanDecimal:
      bClean = true;
      break;
    case ON_AngleValue::StringFormat::CleanFraction:
      bClean = true;
      bFraction = true;
      break;
    default:
      string_format = ON_AngleValue::StringFormat::ExactDecimal;
      break;
    }

    if (false == (angle_value == angle_value))
      break;
    if (ON::AngleUnitSystem::Unset == angle_unit_system)
      break;
    rc.m_angle = angle_value;
    rc.m_angle_unit_system = angle_unit_system;
    const ON_AngleUnitName name = ON_AngleUnitName::Create(locale_id, angle_unit_system, angle_value > 1.0);

    // DO NOT USE A "PRETTY" FORMAT!
    // It is critical that this string scan back to rc.m_angle exactly.
    double sign = ON_DBL_QNAN;
    double proper = ON_DBL_QNAN;
    double numerator = ON_DBL_QNAN;
    double denominator = ON_DBL_QNAN;
    if (
      bFraction 
      && ON_IsAnnotationFractionNumber(rc.m_angle, true, &sign, &proper, &numerator, &denominator)
      )
    {
      rc.m_angle = sign*numerator/denominator;
      if (name.AngleUnitNameIsNotEmpty() )
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g %ls", numerator, denominator, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g", numerator, denominator);
    }
    else
    {
      if (name.AngleUnitNameIsNotEmpty())
        rc.m_angle_as_string.Format(L"%0.17g %ls", rc.m_angle, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g", rc.m_angle);
    }

    rc.m_context_length_unit_system = ON::LengthUnitSystem::None;
    rc.m_context_locale_id = name.LocaleId();

    return rc;
  }
  return ON_AngleValue::Unset;
}